

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O0

void __thiscall CVmBifTable::add_entry(CVmBifTable *this,char *func_set_id)

{
  int iVar1;
  char *pcVar2;
  char *in_RSI;
  long *in_RDI;
  size_t entry_name_len;
  char *entry_vsn;
  size_t name_len;
  char *vsn;
  vm_bif_entry_t *entry;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  ushort in_stack_ffffffffffffffae;
  vm_bif_entry_t *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffc8;
  CVmBifTable *in_stack_ffffffffffffffd0;
  size_t local_28;
  char *local_20;
  vm_bif_entry_t *local_18;
  char *local_10;
  
  local_10 = in_RSI;
  ensure_space(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(size_t)in_RDI);
  local_20 = lib_find_vsn_suffix(local_10,'/',"000000",&local_28);
  local_18 = G_bif_reg_table;
  while( true ) {
    if (local_18->func_set_id == (char *)0x0) {
      add_entry_unresolved
                ((CVmBifTable *)in_stack_ffffffffffffffb0,
                 (char *)CONCAT26(in_stack_ffffffffffffffae,
                                  CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)));
      return;
    }
    pcVar2 = lib_find_vsn_suffix(local_18->func_set_id,'/',"000000",
                                 (size_t *)&stack0xffffffffffffffc8);
    if ((local_28 == in_stack_ffffffffffffffc8) &&
       (iVar1 = memcmp(local_10,local_18->func_set_id,local_28), iVar1 == 0)) break;
    local_18 = local_18 + 1;
  }
  iVar1 = strcmp(local_20,pcVar2);
  if (iVar1 < 1) {
    *(vm_bif_entry_t **)(*in_RDI + (ulong)*(ushort *)(in_RDI + 2) * 8) = local_18;
    pcVar2 = lib_copy_str((char *)in_stack_ffffffffffffffb0);
    *(char **)(in_RDI[1] + (ulong)*(ushort *)(in_RDI + 2) * 8) = pcVar2;
    vm_bif_entry_t::link_to_image(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffae);
    *(short *)(in_RDI + 2) = (short)in_RDI[2] + 1;
    return;
  }
  err_throw_a(0x14a,4,2,local_10,2,pcVar2,7,local_10,8);
}

Assistant:

void CVmBifTable::add_entry(VMG_ const char *func_set_id)
{
    vm_bif_entry_t *entry;
    const char *vsn;
    size_t name_len;

    /* ensure we have space for one more entry */
    ensure_space(count_ + 1, 5);

    /* find the version suffix in the name, if any */
    vsn = lib_find_vsn_suffix(func_set_id, '/', "000000", &name_len);

    /* look up the function set by name */
    for (entry = G_bif_reg_table ; entry->func_set_id != 0 ; ++entry)
    {
        const char *entry_vsn;
        size_t entry_name_len;

        /* find the version number in this entry */
        entry_vsn = lib_find_vsn_suffix(entry->func_set_id, '/', "000000",
                                        &entry_name_len);

        /* see if this is a match */
        if (name_len == entry_name_len
            && memcmp(func_set_id, entry->func_set_id, name_len) == 0)
        {
            /* 
             *   make sure the version provided in the VM is at least as
             *   high as the requested version 
             */
            if (strcmp(vsn, entry_vsn) > 0)
            {
                /* it's out of date - throw "function set too old" */
                err_throw_a(VMERR_FUNCSET_TOO_OLD, 4,
                            ERR_TYPE_TEXTCHAR, func_set_id,
                            ERR_TYPE_TEXTCHAR, entry_vsn,
                            ERR_TYPE_FUNCSET, func_set_id,
                            ERR_TYPE_VERSION_FLAG);
            }

            /* 
             *   It's a match - add the new entry.  Simply keep a pointer
             *   to the static table entry. 
             */
            table_[count_] = entry;

            /* store the new name element as well */
            names_[count_] = lib_copy_str(func_set_id);

            /* complete the linkage to the image file */
            entry->link_to_image(vmg_ count_);

            /* count the new entry */
            ++count_;

            /* we're done */
            return;
        }
    }

    /* we didn't find it - handle it according to our resolution mode */
    add_entry_unresolved(vmg_ func_set_id);
}